

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall dg::vr::GraphBuilder::buildBlock(GraphBuilder *this,BasicBlock *block)

{
  bool bVar1;
  reference pIVar2;
  VRLocation *pVVar3;
  socklen_t __len;
  reference pIVar4;
  undefined8 in_RSI;
  Instruction *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>,_bool>
  pVar5;
  VRLocation *newLoc;
  Instruction *inst;
  VRLocation *previousLoc;
  Instruction *previousInst;
  const_iterator it;
  BasicBlock *in_stack_ffffffffffffff68;
  VRLocation *in_stack_ffffffffffffff70;
  VRLocation *in_stack_ffffffffffffff78;
  sockaddr *in_stack_ffffffffffffff80;
  VRCodeGraph *in_stack_ffffffffffffff90;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_48;
  _Base_ptr local_40;
  undefined1 local_38;
  undefined8 local_30;
  VRLocation *local_28;
  reference local_20;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  local_18.NodePtr = (node_pointer)llvm::BasicBlock::begin(in_stack_ffffffffffffff68);
  local_20 = llvm::
             ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
             ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                          *)0x1bc906);
  local_28 = VRCodeGraph::newVRLocation(in_stack_ffffffffffffff90,in_RDI);
  llvm::
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                *)in_stack_ffffffffffffff70);
  local_30 = local_10;
  pVar5 = std::
          map<llvm::BasicBlock_const*,dg::vr::VRLocation*,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
          ::emplace<llvm::BasicBlock_const*,dg::vr::VRLocation*&>
                    ((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                      *)in_stack_ffffffffffffff80,(BasicBlock **)in_stack_ffffffffffffff78,
                     (VRLocation **)in_stack_ffffffffffffff70);
  local_40 = (_Base_ptr)pVar5.first._M_node;
  local_38 = pVar5.second;
  while( true ) {
    local_48.NodePtr = (node_pointer)llvm::BasicBlock::end(in_stack_ffffffffffffff68);
    bVar1 = llvm::operator!=(&local_18,&local_48);
    if (!bVar1) break;
    pIVar2 = llvm::
             ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
             ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                          *)0x1bc99b);
    pIVar4 = pIVar2;
    pVVar3 = VRCodeGraph::newVRLocation(in_stack_ffffffffffffff90,in_RDI);
    __len = (socklen_t)pIVar4;
    in_stack_ffffffffffffff70 = local_28;
    in_stack_ffffffffffffff78 = pVVar3;
    in_stack_ffffffffffffff80 = (sockaddr *)operator_new(0x18);
    VRInstruction::VRInstruction
              ((VRInstruction *)in_stack_ffffffffffffff70,(Instruction *)in_stack_ffffffffffffff68);
    VRLocation::connect(in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff78,
                        in_stack_ffffffffffffff80,__len);
    local_28 = pVVar3;
    local_20 = pIVar2;
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff70);
  }
  std::
  map<llvm::BasicBlock_const*,dg::vr::VRLocation*,std::less<llvm::BasicBlock_const*>,std::allocator<std::pair<llvm::BasicBlock_const*const,dg::vr::VRLocation*>>>
  ::emplace<llvm::BasicBlock_const*,dg::vr::VRLocation*&>
            ((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              *)in_stack_ffffffffffffff80,(BasicBlock **)in_stack_ffffffffffffff78,
             (VRLocation **)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void GraphBuilder::buildBlock(const llvm::BasicBlock &block) {
    auto it = block.begin();
    const llvm::Instruction *previousInst = &(*it);
    VRLocation *previousLoc = &codeGraph.newVRLocation(previousInst);
    ++it;

    fronts.emplace(&block, previousLoc);

    for (; it != block.end(); ++it) {
        const llvm::Instruction &inst = *it;
        VRLocation &newLoc = codeGraph.newVRLocation(&inst);

        previousLoc->connect(newLoc, new VRInstruction(previousInst));

        previousInst = &inst;
        previousLoc = &newLoc;
    }

    backs.emplace(&block, previousLoc);
}